

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadLinkingSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  uint uVar3;
  ComdatType comdat_type;
  uint local_1d0;
  uint local_1cc;
  uint32_t index_2;
  uint32_t kind_1;
  char *local_1c0;
  Enum local_1b8;
  Enum local_1b4;
  Enum local_1b0;
  Enum local_1ac;
  undefined1 local_1a8 [8];
  string_view name_2;
  uint local_190;
  uint32_t entry_count;
  uint32_t flags_2;
  Enum local_184;
  Enum local_180;
  Enum local_17c;
  uint local_178;
  uint local_174;
  uint32_t func;
  uint32_t priority;
  char *local_168;
  char *local_160;
  Enum local_158;
  Enum local_154;
  Enum local_150;
  Enum local_14c;
  uint local_148;
  uint local_144;
  uint32_t flags_1;
  uint32_t alignment_log2;
  string_view name_1;
  Index i_1;
  uint32_t local_11c;
  char *pcStack_118;
  uint32_t index_1;
  char *local_110;
  Enum local_108;
  Enum local_104;
  Enum local_100;
  Enum local_fc;
  Enum local_f8;
  uint32_t local_f4;
  uint32_t local_f0;
  uint32_t size;
  uint32_t offset;
  uint32_t segment;
  char *local_e0;
  Enum local_d4;
  char *local_d0;
  char *local_c8;
  Enum local_bc;
  char *local_b8;
  char *local_b0;
  Enum local_a8;
  Enum local_a4;
  Enum local_a0;
  uint32_t local_9c;
  Enum local_98;
  uint32_t index;
  Enum local_90;
  SymbolType sym_type;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t kind;
  uint32_t flags;
  string_view name;
  Index i;
  uint local_5c;
  undefined1 local_58 [4];
  uint32_t count;
  ReadEndRestoreGuard guard;
  size_t subsection_end;
  Offset local_38;
  Offset subsection_size;
  uint32_t linking_type;
  Enum local_24;
  uint32_t version;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _version = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb0])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    subsection_size._4_4_ = ReadU32Leb128(this,&linking_type,"version");
    bVar1 = Failed(subsection_size._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else if (linking_type == 2) {
      do {
        if (this->read_end_ <= (this->state_).offset) {
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbf])();
          bVar1 = Succeeded(RVar2);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            Result::Result((Result *)((long)&this_local + 4),Ok);
            return (Result)this_local._4_4_;
          }
          PrintError(this,"EndLinkingSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        RVar2 = ReadU32Leb128(this,(uint32_t *)&subsection_size,"type");
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        RVar2 = ReadOffset(this,&local_38,"subsection size");
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        guard.previous_value_ = (this->state_).offset + local_38;
        if (this->read_end_ < guard.previous_value_) {
          PrintError(this,"invalid sub-section size: extends past end");
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
        ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                           *)local_58,this);
        this->read_end_ = guard.previous_value_;
        switch((undefined4)subsection_size) {
        case 5:
          RVar2 = ReadU32Leb128(this,&local_5c,"info count");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            name_1.size_._4_4_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb8])();
            bVar1 = Succeeded(name_1.size_._4_4_);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              for (name_1.size_._0_4_ = 0; (uint)name_1.size_ < local_5c;
                  name_1.size_._0_4_ = (uint)name_1.size_ + 1) {
                string_view::string_view((string_view *)&flags_1);
                local_14c = (Enum)ReadStr(this,(string_view *)&flags_1,"segment name");
                bVar1 = Failed((Result)local_14c);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                local_150 = (Enum)ReadU32Leb128(this,&local_144,"segment alignment");
                bVar1 = Failed((Result)local_150);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                local_154 = (Enum)ReadU32Leb128(this,&local_148,"segment flags");
                bVar1 = Failed((Result)local_154);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                local_168 = _flags_1;
                local_160 = name_1.data_;
                local_158 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb9])
                                      (this->delegate_,(ulong)(uint)name_1.size_,_flags_1,
                                       name_1.data_,(ulong)local_144,(ulong)local_148);
                bVar1 = Succeeded((Result)local_158);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  PrintError(this,"OnSegmentInfo callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
              }
              goto LAB_00297a37;
            }
            PrintError(this,"OnSegmentInfoCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          break;
        case 6:
          priority = (uint32_t)ReadU32Leb128(this,&local_5c,"info count");
          bVar1 = Failed((Result)priority);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            func = (*this->delegate_->_vptr_BinaryReaderDelegate[0xba])();
            bVar1 = Succeeded((Result)func);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              do {
                uVar3 = local_5c - 1;
                bVar1 = local_5c == 0;
                local_5c = uVar3;
                if (bVar1) goto LAB_00297a37;
                local_17c = (Enum)ReadU32Leb128(this,&local_174,"priority");
                bVar1 = Failed((Result)local_17c);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                local_180 = (Enum)ReadU32Leb128(this,&local_178,"function index");
                bVar1 = Failed((Result)local_180);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                local_184 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbb])
                                      (this->delegate_,(ulong)local_174,(ulong)local_178);
                bVar1 = Succeeded((Result)local_184);
              } while (((bVar1 ^ 0xffU) & 1) == 0);
              PrintError(this,"OnInitFunction callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              PrintError(this,"OnInitFunctionCount callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
          }
          break;
        case 7:
          flags_2 = (uint32_t)ReadU32Leb128(this,&local_5c,"count");
          bVar1 = Failed((Result)flags_2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            entry_count = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbc])();
            bVar1 = Succeeded((Result)entry_count);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              while (uVar3 = local_5c - 1, bVar1 = local_5c != 0, local_5c = uVar3, bVar1) {
                string_view::string_view((string_view *)local_1a8);
                local_1ac = (Enum)ReadStr(this,(string_view *)local_1a8,"comdat name");
                bVar1 = Failed((Result)local_1ac);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                local_1b0 = (Enum)ReadU32Leb128(this,&local_190,"flags");
                bVar1 = Failed((Result)local_1b0);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                local_1b4 = (Enum)ReadU32Leb128(this,(uint32_t *)((long)&name_2.size_ + 4),
                                                "entry count");
                bVar1 = Failed((Result)local_1b4);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                _index_2 = (char *)local_1a8;
                local_1c0 = name_2.data_;
                local_1b8 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbd])
                                      (this->delegate_,local_1a8,name_2.data_,(ulong)local_190,
                                       (ulong)name_2.size_._4_4_);
                bVar1 = Succeeded((Result)local_1b8);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  PrintError(this,"OnComdatBegin callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                while (uVar3 = name_2.size_._4_4_ - 1, bVar1 = name_2.size_._4_4_ != 0,
                      name_2.size_._4_4_ = uVar3, bVar1) {
                  RVar2 = ReadU32Leb128(this,&local_1cc,"kind");
                  bVar1 = Failed(RVar2);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_00297a85;
                  }
                  RVar2 = ReadU32Leb128(this,&local_1d0,"index");
                  bVar1 = Failed(RVar2);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_00297a85;
                  }
                  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbe])
                                          (this->delegate_,(ulong)local_1cc,(ulong)local_1d0);
                  bVar1 = Succeeded(RVar2);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    PrintError(this,"OnComdatEntry callback failed");
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_00297a85;
                  }
                }
              }
              goto LAB_00297a37;
            }
            PrintError(this,"OnComdatCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          break;
        case 8:
          RVar2 = ReadU32Leb128(this,&local_5c,"sym count");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb1])();
            bVar1 = Succeeded(RVar2);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              for (name.size_._4_4_ = 0; name.size_._4_4_ < local_5c;
                  name.size_._4_4_ = name.size_._4_4_ + 1) {
                string_view::string_view((string_view *)&kind);
                local_84 = 0;
                local_88 = 0;
                sym_type = (SymbolType)ReadU32Leb128(this,&local_88,"sym type");
                bVar1 = Failed((Result)sym_type);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                local_90 = (Enum)ReadU32Leb128(this,&local_84,"sym flags");
                bVar1 = Failed((Result)local_90);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                index = local_88;
                local_98 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb2])
                                     (this->delegate_,(ulong)name.size_._4_4_,(ulong)local_88,
                                      (ulong)local_84);
                bVar1 = Succeeded((Result)local_98);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  PrintError(this,"OnSymbol callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                  goto LAB_00297a85;
                }
                switch(index) {
                case 0:
                case 2:
                case 4:
                  local_9c = 0;
                  local_a0 = (Enum)ReadU32Leb128(this,&local_9c,"index");
                  bVar1 = Failed((Result)local_a0);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_00297a85;
                  }
                  if (((local_84 & 0x10) == 0) || ((local_84 & 0x40) != 0)) {
                    local_a4 = (Enum)ReadStr(this,(string_view *)&kind,"symbol name");
                    bVar1 = Failed((Result)local_a4);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_00297a85;
                    }
                  }
                  if (index == 0) {
                    local_b8 = _kind;
                    local_b0 = name.data_;
                    local_a8 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb4])
                                         (this->delegate_,(ulong)name.size_._4_4_,(ulong)local_84,
                                          _kind,name.data_,(ulong)local_9c);
                    bVar1 = Succeeded((Result)local_a8);
                    if (((bVar1 ^ 0xffU) & 1) != 0) {
                      PrintError(this,"OnFunctionSymbol callback failed");
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_00297a85;
                    }
                  }
                  else if (index == 2) {
                    local_d0 = _kind;
                    local_c8 = name.data_;
                    local_bc = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb5])
                                         (this->delegate_,(ulong)name.size_._4_4_,(ulong)local_84,
                                          _kind,name.data_,(ulong)local_9c);
                    bVar1 = Succeeded((Result)local_bc);
                    if (((bVar1 ^ 0xffU) & 1) != 0) {
                      PrintError(this,"OnGlobalSymbol callback failed");
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_00297a85;
                    }
                  }
                  else {
                    if (index != 4) {
                      abort();
                    }
                    _offset = _kind;
                    local_e0 = name.data_;
                    local_d4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb7])
                                         (this->delegate_,(ulong)name.size_._4_4_,(ulong)local_84,
                                          _kind,name.data_,(ulong)local_9c);
                    bVar1 = Succeeded((Result)local_d4);
                    if (((bVar1 ^ 0xffU) & 1) != 0) {
                      PrintError(this,"OnEventSymbol callback failed");
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_00297a85;
                    }
                  }
                  break;
                case 1:
                  size = 0;
                  local_f0 = 0;
                  local_f4 = 0;
                  local_f8 = (Enum)ReadStr(this,(string_view *)&kind,"symbol name");
                  bVar1 = Failed((Result)local_f8);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_00297a85;
                  }
                  if ((local_84 & 0x10) == 0) {
                    local_fc = (Enum)ReadU32Leb128(this,&size,"segment");
                    bVar1 = Failed((Result)local_fc);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_00297a85;
                    }
                    local_100 = (Enum)ReadU32Leb128(this,&local_f0,"offset");
                    bVar1 = Failed((Result)local_100);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_00297a85;
                    }
                    local_104 = (Enum)ReadU32Leb128(this,&local_f4,"size");
                    bVar1 = Failed((Result)local_104);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      bVar1 = true;
                      goto LAB_00297a85;
                    }
                  }
                  pcStack_118 = _kind;
                  local_110 = name.data_;
                  local_108 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb3])
                                        (this->delegate_,(ulong)name.size_._4_4_,(ulong)local_84,
                                         _kind,name.data_,(ulong)size,local_f0,local_f4);
                  bVar1 = Succeeded((Result)local_108);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    PrintError(this,"OnDataSymbol callback failed");
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_00297a85;
                  }
                  break;
                case 3:
                  local_11c = 0;
                  RVar2 = ReadU32Leb128(this,&local_11c,"index");
                  bVar1 = Failed(RVar2);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_00297a85;
                  }
                  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb6])
                                          (this->delegate_,(ulong)name.size_._4_4_,(ulong)local_84,
                                           (ulong)local_11c);
                  bVar1 = Succeeded(RVar2);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    PrintError(this,"OnSectionSymbol callback failed");
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    bVar1 = true;
                    goto LAB_00297a85;
                  }
                }
              }
              goto LAB_00297a37;
            }
            PrintError(this,"OnSymbolCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          break;
        default:
          (this->state_).offset = guard.previous_value_;
LAB_00297a37:
          if ((this->state_).offset == guard.previous_value_) {
            bVar1 = false;
          }
          else {
            PrintError(this,"unfinished sub-section (expected end: 0x%zx)",guard.previous_value_);
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
        }
LAB_00297a85:
        ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
        ~ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                            *)local_58);
      } while (!bVar1);
    }
    else {
      PrintError(this,"invalid linking metadata version: %u",(ulong)linking_type);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    PrintError(this,"BeginLinkingSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadLinkingSection(Offset section_size) {
  CALLBACK(BeginLinkingSection, section_size);
  uint32_t version;
  CHECK_RESULT(ReadU32Leb128(&version, "version"));
  ERROR_UNLESS(version == 2, "invalid linking metadata version: %u", version);
  while (state_.offset < read_end_) {
    uint32_t linking_type;
    Offset subsection_size;
    CHECK_RESULT(ReadU32Leb128(&linking_type, "type"));
    CHECK_RESULT(ReadOffset(&subsection_size, "subsection size"));
    size_t subsection_end = state_.offset + subsection_size;
    ERROR_UNLESS(subsection_end <= read_end_,
                 "invalid sub-section size: extends past end");
    ReadEndRestoreGuard guard(this);
    read_end_ = subsection_end;

    uint32_t count;
    switch (static_cast<LinkingEntryType>(linking_type)) {
      case LinkingEntryType::SymbolTable:
        CHECK_RESULT(ReadU32Leb128(&count, "sym count"));
        CALLBACK(OnSymbolCount, count);
        for (Index i = 0; i < count; ++i) {
          string_view name;
          uint32_t flags = 0;
          uint32_t kind = 0;
          CHECK_RESULT(ReadU32Leb128(&kind, "sym type"));
          CHECK_RESULT(ReadU32Leb128(&flags, "sym flags"));
          SymbolType sym_type = static_cast<SymbolType>(kind);
          CALLBACK(OnSymbol, i, sym_type, flags);
          switch (sym_type) {
            case SymbolType::Function:
            case SymbolType::Global:
            case SymbolType::Event:  {
              uint32_t index = 0;
              CHECK_RESULT(ReadU32Leb128(&index, "index"));
              if ((flags & WABT_SYMBOL_FLAG_UNDEFINED) == 0 ||
                  (flags & WABT_SYMBOL_FLAG_EXPLICIT_NAME) != 0)
                CHECK_RESULT(ReadStr(&name, "symbol name"));
              switch (sym_type) {
                case SymbolType::Function:
                  CALLBACK(OnFunctionSymbol, i, flags, name, index);
                  break;
                case SymbolType::Global:
                  CALLBACK(OnGlobalSymbol, i, flags, name, index);
                  break;
                case SymbolType::Event:
                  CALLBACK(OnEventSymbol, i, flags, name, index);
                  break;
                default:
                  WABT_UNREACHABLE;
              }
              break;
            }
            case SymbolType::Data: {
              uint32_t segment = 0;
              uint32_t offset = 0;
              uint32_t size = 0;
              CHECK_RESULT(ReadStr(&name, "symbol name"));
              if ((flags & WABT_SYMBOL_FLAG_UNDEFINED) == 0) {
                CHECK_RESULT(ReadU32Leb128(&segment, "segment"));
                CHECK_RESULT(ReadU32Leb128(&offset, "offset"));
                CHECK_RESULT(ReadU32Leb128(&size, "size"));
              }
              CALLBACK(OnDataSymbol, i, flags, name, segment, offset, size);
              break;
            }
            case SymbolType::Section: {
              uint32_t index = 0;
              CHECK_RESULT(ReadU32Leb128(&index, "index"));
              CALLBACK(OnSectionSymbol, i, flags, index);
              break;
            }
          }
        }
        break;
      case LinkingEntryType::SegmentInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "info count"));
        CALLBACK(OnSegmentInfoCount, count);
        for (Index i = 0; i < count; i++) {
          string_view name;
          uint32_t alignment_log2;
          uint32_t flags;
          CHECK_RESULT(ReadStr(&name, "segment name"));
          CHECK_RESULT(ReadU32Leb128(&alignment_log2, "segment alignment"));
          CHECK_RESULT(ReadU32Leb128(&flags, "segment flags"));
          CALLBACK(OnSegmentInfo, i, name, alignment_log2, flags);
        }
        break;
      case LinkingEntryType::InitFunctions:
        CHECK_RESULT(ReadU32Leb128(&count, "info count"));
        CALLBACK(OnInitFunctionCount, count);
        while (count--) {
          uint32_t priority;
          uint32_t func;
          CHECK_RESULT(ReadU32Leb128(&priority, "priority"));
          CHECK_RESULT(ReadU32Leb128(&func, "function index"));
          CALLBACK(OnInitFunction, priority, func);
        }
        break;
      case LinkingEntryType::ComdatInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "count"));
        CALLBACK(OnComdatCount, count);
        while (count--) {
          uint32_t flags;
          uint32_t entry_count;
          string_view name;
          CHECK_RESULT(ReadStr(&name, "comdat name"));
          CHECK_RESULT(ReadU32Leb128(&flags, "flags"));
          CHECK_RESULT(ReadU32Leb128(&entry_count, "entry count"));
          CALLBACK(OnComdatBegin, name, flags, entry_count);
          while (entry_count--) {
            uint32_t kind;
            uint32_t index;
            CHECK_RESULT(ReadU32Leb128(&kind, "kind"));
            CHECK_RESULT(ReadU32Leb128(&index, "index"));
            ComdatType comdat_type = static_cast<ComdatType>(kind);
            CALLBACK(OnComdatEntry, comdat_type, index);
          }
        }
        break;
      default:
        // Unknown subsection, skip it.
        state_.offset = subsection_end;
        break;
    }
    ERROR_UNLESS(state_.offset == subsection_end,
                 "unfinished sub-section (expected end: 0x%" PRIzx ")",
                 subsection_end);
  }
  CALLBACK0(EndLinkingSection);
  return Result::Ok;
}